

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O2

vector<despot::State_*,_std::allocator<despot::State_*>_> *
despot::ParticleBelief::Resample
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,int num
          ,vector<despot::State_*,_std::allocator<despot::State_*>_> *belief,DSPOMDP *model,
          History *history,int hstart)

{
  double dVar1;
  value_type pSVar2;
  int iVar3;
  undefined4 extraout_var;
  pointer ppSVar4;
  log_ostream *plVar5;
  ostream *poVar6;
  ulong uVar7;
  int i;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int i_2;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar14;
  double dVar15;
  State *particle;
  OBS_TYPE obs;
  double reward;
  double local_88;
  value_type local_80;
  int local_74;
  double local_70;
  int local_64;
  double local_60;
  double local_58;
  ulong local_50;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *local_48;
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  
  local_58 = 1.0 / (double)num;
  local_88 = Random::NextDouble((Random *)&Random::RANDOM,0.0,local_58);
  local_60 = (*(belief->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
               _M_impl.super__Vector_impl_data._M_start)->weight;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70 = -INFINITY;
  local_64 = num * 200;
  local_50 = (ulong)hstart;
  iVar8 = 0;
  iVar10 = 0;
  iVar11 = 0;
  local_48 = belief;
  do {
    if ((num <= iVar11) || (local_64 <= iVar8)) {
      ppSVar4 = (__return_storage_ptr__->
                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      dVar15 = 0.0;
      for (uVar9 = 0;
          uVar7 = (long)(__return_storage_ptr__->
                        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4 >> 3,
          uVar9 < uVar7; uVar9 = uVar9 + 1) {
        dVar1 = exp(ppSVar4[uVar9]->weight - local_70);
        ppSVar4 = (__return_storage_ptr__->
                  super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        ppSVar4[uVar9]->weight = dVar1;
        dVar15 = dVar15 + dVar1;
      }
      for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
        ppSVar4[uVar9]->weight = ppSVar4[uVar9]->weight / dVar15;
      }
      iVar11 = logging::level();
      if ((0 < iVar11) && (iVar11 = logging::level(), 3 < iVar11)) {
        plVar5 = logging::stream(4);
        poVar6 = std::operator<<(&plVar5->super_ostream,"[Belief::Resample] Resampled ");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6," particles");
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      for (uVar9 = 0;
          uVar9 < (ulong)((long)(__return_storage_ptr__->
                                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(__return_storage_ptr__->
                                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 3); uVar9 = uVar9 + 1)
      {
        iVar11 = logging::level();
        if ((0 < iVar11) && (iVar11 = logging::level(), 4 < iVar11)) {
          plVar5 = logging::stream(5);
          poVar6 = std::operator<<(&plVar5->super_ostream," ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)uVar9);
          poVar6 = std::operator<<(poVar6," = ");
          poVar6 = despot::operator<<(poVar6,(__return_storage_ptr__->
                                             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                             )._M_impl.super__Vector_impl_data._M_start[uVar9]);
          std::endl<char,std::char_traits<char>>(poVar6);
        }
      }
      return __return_storage_ptr__;
    }
    ppSVar4 = (local_48->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    for (; local_60 < local_88; local_60 = local_60 + ppSVar4[iVar10]->weight) {
      iVar10 = iVar10 + 1;
      if ((long)(local_48->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4 >> 3 == (long)iVar10) {
        iVar10 = 0;
      }
    }
    iVar3 = (*model->_vptr_DSPOMDP[0x16])(model);
    local_80 = (value_type)CONCAT44(extraout_var,iVar3);
    iVar8 = iVar8 + 1;
    local_88 = local_88 + local_58;
    dVar15 = 0.0;
    for (uVar9 = local_50; pSVar2 = local_80,
        uVar9 < (ulong)((long)(history->actions_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(history->actions_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2); uVar9 = uVar9 + 1) {
      dVar1 = Random::NextDouble((Random *)&Random::RANDOM);
      (*model->_vptr_DSPOMDP[2])
                (SUB84(dVar1,0),model,pSVar2,
                 (ulong)(uint)(history->actions_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar9],local_38,local_40);
      (*model->_vptr_DSPOMDP[7])
                (model,(history->observations_).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar9],local_80,
                 (ulong)(uint)(history->actions_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar9]);
      if ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) < 0.0 ||
          (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) == 0.0) {
        (*model->_vptr_DSPOMDP[0x17])(model);
        break;
      }
      dVar1 = log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      dVar15 = dVar15 + dVar1;
    }
    if ((local_80->super_MemoryObject).allocated_ == true) {
      local_80->weight = dVar15;
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
                (__return_storage_ptr__,&local_80);
      iVar11 = iVar11 + 1;
      uVar13 = SUB84(local_70,0);
      uVar14 = (undefined4)((ulong)local_70 >> 0x20);
      if (local_70 <= dVar15) {
        uVar13 = SUB84(dVar15,0);
        uVar14 = (undefined4)((ulong)dVar15 >> 0x20);
      }
      local_70 = (double)CONCAT44(uVar14,uVar13);
    }
    if (iVar11 == num) {
      uVar9 = (ulong)((long)(__return_storage_ptr__->
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(__return_storage_ptr__->
                           super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                           _M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
      local_74 = num;
      while( true ) {
        uVar9 = uVar9 - 1;
        iVar11 = local_74;
        if ((int)(uint)uVar9 < 0) break;
        uVar12 = (uint)uVar9 & 0x7fffffff;
        dVar15 = (__return_storage_ptr__->
                 super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar12]->weight - local_70;
        dVar1 = log(local_58);
        if (dVar15 < dVar1) {
          (*model->_vptr_DSPOMDP[0x17])
                    (model,(__return_storage_ptr__->
                           super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                           _M_impl.super__Vector_impl_data._M_start[uVar12]);
          std::vector<despot::State_*,_std::allocator<despot::State_*>_>::erase
                    (__return_storage_ptr__,
                     (const_iterator)
                     ((__return_storage_ptr__->
                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl
                      .super__Vector_impl_data._M_start + uVar12));
          local_74 = local_74 + -1;
        }
      }
    }
  } while( true );
}

Assistant:

vector<State*> ParticleBelief::Resample(int num, const vector<State*>& belief,
	const DSPOMDP* model, History history, int hstart) {
	double unit = 1.0 / num;
	double mass = Random::RANDOM.NextDouble(0, unit);
	int pos = 0;
	double cur = belief[0]->weight;

	double reward;
	OBS_TYPE obs;

	vector<State*> sample;
	int count = 0;
	double max_wgt = Globals::NEG_INFTY;
	int trial = 0;
	while (count < num && trial < 200 * num) {
		// Pick next particle
		while (mass > cur) {
			pos++;
			if (pos == belief.size())
				pos = 0;

			cur += belief[pos]->weight;
		}
		trial++;

		mass += unit;

		State* particle = model->Copy(belief[pos]);

		// Step through history
		double log_wgt = 0;
		for (int i = hstart; i < history.Size(); i++) {
			model->Step(*particle, Random::RANDOM.NextDouble(),
				history.Action(i), reward, obs);

			double prob = model->ObsProb(history.Observation(i), *particle,
				history.Action(i));
			if (prob > 0) {
				log_wgt += log(prob);
			} else {
				model->Free(particle);
				break;
			}
		}

		// Add to sample if survived
		if (particle->IsAllocated()) {
			count++;

			particle->weight = log_wgt;
			sample.push_back(particle);

			max_wgt = max(log_wgt, max_wgt);
		}

		// Remove particles with very small weights
		if (count == num) {
			for (int i = sample.size() - 1; i >= 0; i--)
				if (sample[i]->weight - max_wgt < log(1.0 / num)) {
					model->Free(sample[i]);
					sample.erase(sample.begin() + i);
					count--;
				}
		}
	}

	double total_weight = 0;
	for (int i = 0; i < sample.size(); i++) {
		sample[i]->weight = exp(sample[i]->weight - max_wgt);
		total_weight += sample[i]->weight;
	}
	for (int i = 0; i < sample.size(); i++) {
		sample[i]->weight = sample[i]->weight / total_weight;
	}

	logd << "[Belief::Resample] Resampled " << sample.size() << " particles"
		<< endl;
	for (int i = 0; i < sample.size(); i++) {
		logv << " " << i << " = " << *sample[i] << endl;
	}

	return sample;
}